

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gptgen.cpp
# Opt level: O0

int read_block(string *drive,uint64_t lba,int block_size,char *buf)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  fpos<__mbstate_t> local_258;
  undefined4 local_248;
  long local_238;
  ifstream fin;
  char *buf_local;
  int block_size_local;
  uint64_t lba_local;
  string *drive_local;
  
  std::ifstream::ifstream(&local_238);
  _Var2 = std::__cxx11::string::c_str();
  std::ifstream::open((char *)&local_238,_Var2);
  bVar1 = std::ios::operator!((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::fpos<__mbstate_t>::fpos(&local_258,lba * (long)block_size);
    std::istream::seekg(&local_238,local_258._M_off,local_258._M_state);
    std::istream::read((char *)&local_238,(long)buf);
    std::ifstream::close();
    drive_local._4_4_ = 0;
  }
  else {
    drive_local._4_4_ = -1;
  }
  local_248 = 1;
  std::ifstream::~ifstream(&local_238);
  return drive_local._4_4_;
}

Assistant:

int read_block(string drive, uint64_t lba, int block_size, char *buf)
{
	ifstream fin;

	fin.open(drive.c_str(), ios_base::binary);
	if (!fin)
		return -1;
	fin.seekg(lba*block_size);
	fin.read(buf, block_size);
	fin.close();
	return 0;
}